

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int Correct(string *modelFile)

{
  bool bVar1;
  ostream *poVar2;
  istream *piVar3;
  NJamSpell local_1c8 [32];
  undefined1 local_1a8 [8];
  wstring result;
  NJamSpell local_188 [8];
  wstring wtext;
  string local_168 [8];
  string line;
  undefined1 local_138 [8];
  TSpellCorrector corrector;
  string *modelFile_local;
  
  corrector.MaxCandidatesToCheck = (size_t)modelFile;
  NJamSpell::TSpellCorrector::TSpellCorrector((TSpellCorrector *)local_138);
  poVar2 = std::operator<<((ostream *)&std::cerr,"[info] loading model");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  bVar1 = NJamSpell::TSpellCorrector::LoadLangModel
                    ((TSpellCorrector *)local_138,(string *)corrector.MaxCandidatesToCheck);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[info] loaded");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cerr,">> ");
    std::__cxx11::string::string(local_168);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&std::cin,local_168);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      NJamSpell::UTF8ToWide(local_188,(string *)local_168);
      NJamSpell::TSpellCorrector::FixFragment((TSpellCorrector *)local_1a8,(wstring *)local_138);
      NJamSpell::WideToUTF8(local_1c8,(wstring *)local_1a8);
      poVar2 = std::operator<<((ostream *)&std::cerr,(string *)local_1c8);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)local_1c8);
      std::operator<<((ostream *)&std::cerr,">> ");
      std::__cxx11::wstring::~wstring((wstring *)local_1a8);
      std::__cxx11::wstring::~wstring((wstring *)local_188);
    }
    std::__cxx11::string::~string(local_168);
    modelFile_local._4_4_ = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[error] failed to load model");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    modelFile_local._4_4_ = 0x2a;
  }
  NJamSpell::TSpellCorrector::~TSpellCorrector((TSpellCorrector *)local_138);
  return modelFile_local._4_4_;
}

Assistant:

int Correct(const std::string& modelFile) {
    TSpellCorrector corrector;
    std::cerr << "[info] loading model" << std::endl;
    if (!corrector.LoadLangModel(modelFile)) {
        std::cerr << "[error] failed to load model" << std::endl;
        return 42;
    }
    std::cerr << "[info] loaded" << std::endl;
    std::cerr << ">> ";
    for (std::string line; std::getline(std::cin, line);) {
        std::wstring wtext = UTF8ToWide(line);
        std::wstring result = corrector.FixFragment(wtext);
        std::cerr << WideToUTF8(result) << "\n";
        std::cerr << ">> ";
    }
    return 0;
}